

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

void Timidity::PrintDLS(DLS_Data *data)

{
  uint local_1c;
  uint local_18;
  DWORD i_2;
  DWORD i_1;
  DWORD i;
  DLS_Data *data_local;
  
  printf("DLS Data:\n");
  printf("cInstruments = %u\n",(ulong)data->cInstruments);
  if (data->instruments != (DLS_Instrument *)0x0) {
    for (i_2 = 0; i_2 < data->cInstruments; i_2 = i_2 + 1) {
      PrintInstrument(data->instruments + i_2,i_2);
    }
  }
  if ((data->ptbl != (POOLTABLE *)0x0) && (data->ptbl->cCues != 0)) {
    printf("Cues: ");
    for (local_18 = 0; local_18 < data->ptbl->cCues; local_18 = local_18 + 1) {
      if (local_18 != 0) {
        printf(", ");
      }
      printf("%u",(ulong)data->ptblList[local_18].ulOffset);
    }
    printf("\n");
  }
  if ((data->waveList != (DLS_Wave *)0x0) && (data->ptbl != (POOLTABLE *)0x0)) {
    printf("Waves:\n");
    for (local_1c = 0; local_1c < data->ptbl->cCues; local_1c = local_1c + 1) {
      PrintWave(data->waveList + local_1c,local_1c);
    }
  }
  if (data->name != (char *)0x0) {
    printf("Name: %s\n",data->name);
  }
  if (data->artist != (char *)0x0) {
    printf("Artist: %s\n",data->artist);
  }
  if (data->copyright != (char *)0x0) {
    printf("Copyright: %s\n",data->copyright);
  }
  if (data->comments != (char *)0x0) {
    printf("Comments: %s\n",data->comments);
  }
  return;
}

Assistant:

void PrintDLS(DLS_Data *data)
{
	printf("DLS Data:\n");
	printf("cInstruments = %u\n", data->cInstruments); 
	if ( data->instruments ) {
		DWORD i;
		for ( i = 0; i < data->cInstruments; ++i ) {
			PrintInstrument(&data->instruments[i], i);
		}
	}
	if ( data->ptbl && data->ptbl->cCues > 0 ) {
		DWORD i;
		printf("Cues: ");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			if ( i > 0 ) {
				printf(", ");
			}
			printf("%u", data->ptblList[i].ulOffset);
		}
		printf("\n");
	}
	if ( data->waveList && data->ptbl ) {
		DWORD i;
		printf("Waves:\n");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			PrintWave(&data->waveList[i], i);
		}
	}
	if ( data->name ) {
		printf("Name: %s\n", data->name);
	}
	if ( data->artist ) {
		printf("Artist: %s\n", data->artist);
	}
	if ( data->copyright ) {
		printf("Copyright: %s\n", data->copyright);
	}
	if ( data->comments ) {
		printf("Comments: %s\n", data->comments);
	}
}